

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3ExprImpliesNonNullRow(Expr *p,int iTab)

{
  int iVar1;
  Expr *pExpr;
  long lVar2;
  Walker WStack_58;
  
  pExpr = sqlite3ExprSkipCollate(p);
  for (; pExpr != (Expr *)0x0; pExpr = *(Expr **)(&pExpr->op + lVar2)) {
    lVar2 = 0x10;
    if (pExpr->op != '3') {
      if (pExpr->op != ',') break;
      iVar1 = sqlite3ExprImpliesNonNullRow(pExpr->pLeft,iTab);
      lVar2 = 0x18;
      if (iVar1 != 0) {
        return 1;
      }
    }
  }
  WStack_58.xExprCallback = impliesNotNullRow;
  WStack_58.eCode = 0;
  WStack_58.xSelectCallback = (_func_int_Walker_ptr_Select_ptr *)0x0;
  WStack_58.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)0x0;
  WStack_58.u.n = iTab;
  sqlite3WalkExpr(&WStack_58,pExpr);
  return (uint)WStack_58.eCode;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprImpliesNonNullRow(Expr *p, int iTab){
  Walker w;
  p = sqlite3ExprSkipCollate(p);
  while( p ){
    if( p->op==TK_NOTNULL ){
      p = p->pLeft;
    }else if( p->op==TK_AND ){
      if( sqlite3ExprImpliesNonNullRow(p->pLeft, iTab) ) return 1;
      p = p->pRight;
    }else{
      break;
    }
  }
  w.xExprCallback = impliesNotNullRow;
  w.xSelectCallback = 0;
  w.xSelectCallback2 = 0;
  w.eCode = 0;
  w.u.iCur = iTab;
  sqlite3WalkExpr(&w, p);
  return w.eCode;
}